

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Error ft_var_load_hvvar(TT_Face face,FT_Bool vertical)

{
  FT_ULong FVar1;
  FT_ULong FVar2;
  FT_ULong FVar3;
  FT_Pointer pvVar4;
  FT_ULong widthMap_offset;
  FT_ULong store_offset;
  FT_ULong table_offset;
  FT_ULong table_len;
  FT_UShort majorVersion;
  GX_ItemVarStore pGStack_38;
  FT_Error error;
  GX_HVVarTable table;
  GX_Blend blend;
  FT_Memory memory;
  FT_Stream stream;
  TT_Face pTStack_10;
  FT_Bool vertical_local;
  TT_Face face_local;
  
  memory = (FT_Memory)(face->root).stream;
  blend = (GX_Blend)((FT_Stream)memory)->memory;
  table = (GX_HVVarTable)face->blend;
  stream._7_1_ = vertical;
  pTStack_10 = face;
  if (vertical == '\0') {
    ((GX_Blend)table)->hvar_loaded = '\x01';
    table_len._4_4_ = (*face->goto_table)(face,0x48564152,(FT_Stream)memory,&table_offset);
  }
  else {
    ((GX_Blend)table)->vvar_loaded = '\x01';
    table_len._4_4_ = (*face->goto_table)(face,0x56564152,(FT_Stream)memory,&table_offset);
  }
  if (table_len._4_4_ == 0) {
    FVar1 = FT_Stream_Pos((FT_Stream)memory);
    table_len._2_2_ = FT_Stream_ReadUShort((FT_Stream)memory,(FT_Error *)((long)&table_len + 4));
    if ((table_len._4_4_ == 0) &&
       (table_len._4_4_ = FT_Stream_Skip((FT_Stream)memory,2), table_len._4_4_ == 0)) {
      if (table_len._2_2_ == 1) {
        FVar2 = FT_Stream_ReadULong((FT_Stream)memory,(FT_Error *)((long)&table_len + 4));
        if ((table_len._4_4_ == 0) &&
           (FVar3 = FT_Stream_ReadULong((FT_Stream)memory,(FT_Error *)((long)&table_len + 4)),
           table_len._4_4_ == 0)) {
          if (stream._7_1_ == '\0') {
            pvVar4 = ft_mem_alloc((FT_Memory)blend,0x38,(FT_Error *)((long)&table_len + 4));
            *(FT_Pointer *)&table[1].itemStore.axisCount = pvVar4;
            if (table_len._4_4_ != 0) goto LAB_0033dd7d;
            pGStack_38 = *(GX_ItemVarStore *)&table[1].itemStore.axisCount;
          }
          else {
            pvVar4 = ft_mem_alloc((FT_Memory)blend,0x38,(FT_Error *)((long)&table_len + 4));
            *(FT_Pointer *)&table[1].widthMap = pvVar4;
            if (table_len._4_4_ != 0) goto LAB_0033dd7d;
            pGStack_38 = *(GX_ItemVarStore *)&table[1].widthMap;
          }
          table_len._4_4_ = ft_var_load_item_variation_store(pTStack_10,FVar1 + FVar2,pGStack_38);
          if ((table_len._4_4_ == 0) &&
             ((FVar3 == 0 ||
              (table_len._4_4_ =
                    ft_var_load_delta_set_index_mapping
                              (pTStack_10,FVar1 + FVar3,(GX_DeltaSetIdxMap)(pGStack_38 + 1),
                               pGStack_38), table_len._4_4_ == 0)))) {
            table_len._4_4_ = 0;
          }
        }
      }
      else {
        table_len._4_4_ = 8;
      }
    }
  }
LAB_0033dd7d:
  if (table_len._4_4_ == 0) {
    if (stream._7_1_ == '\0') {
      *(undefined1 *)((long)&table[1].itemStore.varData + 1) = 1;
      pTStack_10->variation_support = pTStack_10->variation_support | 2;
    }
    else {
      *(undefined1 *)((long)&table[1].itemStore.varRegionList + 1) = 1;
      pTStack_10->variation_support = pTStack_10->variation_support | 0x10;
    }
  }
  return table_len._4_4_;
}

Assistant:

static FT_Error
  ft_var_load_hvvar( TT_Face  face,
                     FT_Bool  vertical )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    GX_Blend  blend = face->blend;

    GX_HVVarTable  table;

    FT_Error   error;
    FT_UShort  majorVersion;
    FT_ULong   table_len;
    FT_ULong   table_offset;
    FT_ULong   store_offset;
    FT_ULong   widthMap_offset;


    if ( vertical )
    {
      blend->vvar_loaded = TRUE;

      FT_TRACE2(( "VVAR " ));

      error = face->goto_table( face, TTAG_VVAR, stream, &table_len );
    }
    else
    {
      blend->hvar_loaded = TRUE;

      FT_TRACE2(( "HVAR " ));

      error = face->goto_table( face, TTAG_HVAR, stream, &table_len );
    }

    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));
      goto Exit;
    }

    table_offset = FT_STREAM_POS();

    /* skip minor version */
    if ( FT_READ_USHORT( majorVersion ) ||
         FT_STREAM_SKIP( 2 )            )
      goto Exit;

    if ( majorVersion != 1 )
    {
      FT_TRACE2(( "bad table version %d\n", majorVersion ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    if ( FT_READ_ULONG( store_offset )    ||
         FT_READ_ULONG( widthMap_offset ) )
      goto Exit;

    if ( vertical )
    {
      if ( FT_NEW( blend->vvar_table ) )
        goto Exit;
      table = blend->vvar_table;
    }
    else
    {
      if ( FT_NEW( blend->hvar_table ) )
        goto Exit;
      table = blend->hvar_table;
    }

    error = ft_var_load_item_variation_store(
              face,
              table_offset + store_offset,
              &table->itemStore );
    if ( error )
      goto Exit;

    if ( widthMap_offset )
    {
      error = ft_var_load_delta_set_index_mapping(
                face,
                table_offset + widthMap_offset,
                &table->widthMap,
                &table->itemStore );
      if ( error )
        goto Exit;
    }

    FT_TRACE2(( "loaded\n" ));
    error = FT_Err_Ok;

  Exit:
    if ( !error )
    {
      if ( vertical )
      {
        blend->vvar_checked = TRUE;

        /* FreeType doesn't provide functions to quickly retrieve    */
        /* TSB, BSB, or VORG values; we thus don't have to implement */
        /* support for those three item variation stores.            */

        face->variation_support |= TT_FACE_FLAG_VAR_VADVANCE;
      }
      else
      {
        blend->hvar_checked = TRUE;

        /* FreeType doesn't provide functions to quickly retrieve */
        /* LSB or RSB values; we thus don't have to implement     */
        /* support for those two item variation stores.           */

        face->variation_support |= TT_FACE_FLAG_VAR_HADVANCE;
      }
    }

    return error;
  }